

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

decimal_fp<float> fmt::v9::detail::dragonbox::to_decimal<float>(float x)

{
  compute_mul_parity_result cVar1;
  int iVar2;
  compute_mul_result cVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  char cVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  bool bVar16;
  cache_entry_type cache;
  
  uVar11 = (uint)x & 0x7fffff;
  uVar10 = (uint)x >> 0x17 & 0xff;
  if (uVar10 == 0) {
    uVar10 = 0xffffff6b;
    if (uVar11 == 0) {
      uVar15 = 0;
      uVar8 = 0;
      goto LAB_00140dee;
    }
LAB_00140bdb:
    uVar14 = (int)(uVar10 * 0x4d105) >> 0x14;
    uVar15 = (ulong)uVar14;
    cache = *(cache_entry_type *)
             (cache_accessor<float>::get_cached_power(int)::pow10_significands +
             (ulong)(0x20 - uVar14) * 8);
    iVar5 = ((int)((1 - uVar14) * 0x1a934f) >> 0x13) + uVar10;
    uVar13 = cache >> (~(byte)iVar5 & 0x3f);
    cVar3 = cache_accessor<float>::compute_mul(uVar11 * 2 + 1 << ((byte)iVar5 & 0x1f),&cache);
    uVar8 = ((ulong)cVar3 & 0xffffffff) / 100;
    iVar6 = (int)uVar8;
    iVar2 = (int)(((ulong)cVar3 & 0xffffffff) / 100);
    uVar10 = iVar2 * -100 + cVar3.result;
    uVar7 = (uint)uVar13;
    if (uVar10 < uVar7) {
      if ((uVar10 != 0) || ((uVar11 & 1 & cVar3._4_4_) == 0)) {
LAB_00140c94:
        iVar5 = uVar14 - 1;
        do {
          uVar15 = uVar8;
          iVar2 = (int)uVar15;
          uVar10 = iVar2 * 0x40000000 | (uint)(iVar2 * -0x3d70a3d7) >> 2;
          iVar5 = iVar5 + 2;
          uVar8 = (ulong)uVar10;
        } while (uVar10 < 0x28f5c29);
        uVar10 = (uint)(iVar2 * -0x33333333) >> 1 | (uint)((iVar2 * -0x33333333 & 1U) != 0) << 0x1f;
        bVar16 = uVar10 < 0x1999999a;
        uVar8 = (ulong)uVar10;
        if (!bVar16) {
          uVar8 = uVar15;
        }
        goto LAB_00140dea;
      }
      iVar6 = iVar2 + -1;
      uVar10 = 100;
    }
    else if ((uVar10 <= uVar7) &&
            (cVar1 = cache_accessor<float>::compute_mul_parity(uVar11 * 2 - 1,&cache,iVar5),
            (~uVar11 & (uint)((ushort)cVar1 >> 8) & 1) != 0 || ((ushort)cVar1 & 1) != 0))
    goto LAB_00140c94;
    uVar10 = uVar10 - (uVar7 >> 1);
    uVar7 = uVar10 * 0x199a + 0x8002;
    uVar14 = uVar7 >> 0x10;
    uVar12 = iVar6 * 10 + uVar14;
    uVar8 = (ulong)uVar12;
    if ((uVar7 & 0xffff) < 0x199a) {
      cVar1 = cache_accessor<float>::compute_mul_parity(uVar11 * 2,&cache,iVar5);
      if ((uVar10 & 1) == ((ushort)cVar1 & 1)) {
        uVar8 = (ulong)(uVar12 - (uVar14 & (ushort)cVar1 >> 8 & 1));
      }
      else {
        uVar8 = (ulong)(uVar12 - 1);
      }
    }
  }
  else {
    uVar10 = uVar10 - 0x96;
    if (uVar11 != 0) {
      uVar11 = uVar11 | 0x800000;
      goto LAB_00140bdb;
    }
    uVar7 = (int)(uVar10 * 0x9a209 + -0x3fe1f) >> 0x15;
    uVar15 = (ulong)uVar7;
    cVar9 = (char)((int)(uVar7 * -0x1a934f) >> 0x13) + (char)uVar10;
    uVar8 = *(ulong *)(cache_accessor<float>::get_cached_power(int)::pow10_significands +
                      (ulong)(0x1f - uVar7) * 8);
    bVar4 = 0x28 - cVar9;
    uVar11 = (uint)((uVar10 & 0xfffffffe) != 2) + (int)(uVar8 - (uVar8 >> 0x19) >> (bVar4 & 0x3f));
    uVar13 = ((uVar8 >> 0x18) + uVar8 >> (bVar4 & 0x3f) & 0xffffffff) / 10;
    if ((uint)((int)uVar13 * 10) < uVar11) {
      uVar7 = (int)(uVar8 >> (0x27U - cVar9 & 0x3f)) + 1U >> 1;
      if (uVar10 == 0xffffffdd) {
        uVar8 = (ulong)(uVar7 & 0xfffffffe);
      }
      else {
        uVar8 = (ulong)(uVar7 + (uVar7 < uVar11));
      }
      goto LAB_00140dee;
    }
    iVar5 = uVar7 - 1;
    do {
      uVar15 = uVar13;
      iVar2 = (int)uVar15;
      uVar10 = iVar2 * 0x40000000 | (uint)(iVar2 * -0x3d70a3d7) >> 2;
      iVar5 = iVar5 + 2;
      uVar13 = (ulong)uVar10;
    } while (uVar10 < 0x28f5c29);
    uVar10 = (uint)(iVar2 * -0x33333333) >> 1 | (uint)((iVar2 * -0x33333333 & 1U) != 0) << 0x1f;
    bVar16 = uVar10 < 0x1999999a;
    uVar8 = (ulong)uVar10;
    if (!bVar16) {
      uVar8 = uVar15;
    }
LAB_00140dea:
    uVar15 = (ulong)(iVar5 + (uint)bVar16);
  }
LAB_00140dee:
  return (decimal_fp<float>)(uVar8 | uVar15 << 0x20);
}

Assistant:

static uint64_t get_cached_power(int k) noexcept {
    FMT_ASSERT(k >= float_info<float>::min_k && k <= float_info<float>::max_k,
               "k is out of range");
    static constexpr const uint64_t pow10_significands[] = {
        0x81ceb32c4b43fcf5, 0xa2425ff75e14fc32, 0xcad2f7f5359a3b3f,
        0xfd87b5f28300ca0e, 0x9e74d1b791e07e49, 0xc612062576589ddb,
        0xf79687aed3eec552, 0x9abe14cd44753b53, 0xc16d9a0095928a28,
        0xf1c90080baf72cb2, 0x971da05074da7bef, 0xbce5086492111aeb,
        0xec1e4a7db69561a6, 0x9392ee8e921d5d08, 0xb877aa3236a4b44a,
        0xe69594bec44de15c, 0x901d7cf73ab0acda, 0xb424dc35095cd810,
        0xe12e13424bb40e14, 0x8cbccc096f5088cc, 0xafebff0bcb24aaff,
        0xdbe6fecebdedd5bf, 0x89705f4136b4a598, 0xabcc77118461cefd,
        0xd6bf94d5e57a42bd, 0x8637bd05af6c69b6, 0xa7c5ac471b478424,
        0xd1b71758e219652c, 0x83126e978d4fdf3c, 0xa3d70a3d70a3d70b,
        0xcccccccccccccccd, 0x8000000000000000, 0xa000000000000000,
        0xc800000000000000, 0xfa00000000000000, 0x9c40000000000000,
        0xc350000000000000, 0xf424000000000000, 0x9896800000000000,
        0xbebc200000000000, 0xee6b280000000000, 0x9502f90000000000,
        0xba43b74000000000, 0xe8d4a51000000000, 0x9184e72a00000000,
        0xb5e620f480000000, 0xe35fa931a0000000, 0x8e1bc9bf04000000,
        0xb1a2bc2ec5000000, 0xde0b6b3a76400000, 0x8ac7230489e80000,
        0xad78ebc5ac620000, 0xd8d726b7177a8000, 0x878678326eac9000,
        0xa968163f0a57b400, 0xd3c21bcecceda100, 0x84595161401484a0,
        0xa56fa5b99019a5c8, 0xcecb8f27f4200f3a, 0x813f3978f8940985,
        0xa18f07d736b90be6, 0xc9f2c9cd04674edf, 0xfc6f7c4045812297,
        0x9dc5ada82b70b59e, 0xc5371912364ce306, 0xf684df56c3e01bc7,
        0x9a130b963a6c115d, 0xc097ce7bc90715b4, 0xf0bdc21abb48db21,
        0x96769950b50d88f5, 0xbc143fa4e250eb32, 0xeb194f8e1ae525fe,
        0x92efd1b8d0cf37bf, 0xb7abc627050305ae, 0xe596b7b0c643c71a,
        0x8f7e32ce7bea5c70, 0xb35dbf821ae4f38c, 0xe0352f62a19e306f};
    return pow10_significands[k - float_info<float>::min_k];
  }